

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferFFS.cpp
# Opt level: O0

void __thiscall adios2::format::BufferFFS::~BufferFFS(BufferFFS *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__BufferFFS_01133ab8;
  free_FFSBuffer(in_RDI[8]);
  Buffer::~Buffer((Buffer *)0xadc1f6);
  return;
}

Assistant:

BufferFFS::~BufferFFS() { free_FFSBuffer(m_buffer); }